

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerVk.cpp
# Opt level: O0

void __thiscall
Diligent::anon_unknown_77::BindResourceHelper::CacheTexelBuffer
          (BindResourceHelper *this,BindResourceInfo *BindInfo)

{
  Uint32 ArrayIndex;
  undefined8 ResDesc;
  BUFFER_VIEW_TYPE BVar1;
  PIPELINE_RESOURCE_FLAGS PVar2;
  Char *pCVar3;
  BufferViewVkImpl *pBVar4;
  IDeviceObject *pIVar5;
  PipelineResourceSignatureDesc *pPVar6;
  initializer_list<Diligent::BUFFER_VIEW_TYPE> ExpectedViewTypes;
  char *in_stack_ffffffffffffff00;
  PipelineResourceDesc *pPVar7;
  undefined1 local_b0 [8];
  string msg_2;
  BUFFER_VIEW_TYPE RequiredViewType;
  RefCntAutoPtr<Diligent::BufferViewVkImpl> pBufferViewVk;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  BindResourceInfo *BindInfo_local;
  BindResourceHelper *this_local;
  
  msg.field_2._8_8_ = BindInfo;
  if (BindInfo->pObject == (IDeviceObject *)0x0) {
    FormatString<char[74]>
              ((string *)local_38,
               (char (*) [74])
               "Setting texel buffer to null is handled by BindResourceHelper::operator()");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"CacheTexelBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
               ,0x1db);
    std::__cxx11::string::~string((string *)local_38);
  }
  if (((this->m_DstRes->Type != UniformTexelBuffer) && (this->m_DstRes->Type != StorageTexelBuffer))
     && (this->m_DstRes->Type != StorageTexelBuffer_ReadOnly)) {
    FormatString<char[47]>
              ((string *)&pBufferViewVk,
               (char (*) [47])"Uniform or storage buffer resource is expected");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"CacheTexelBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
               ,0x1df);
    std::__cxx11::string::~string((string *)&pBufferViewVk);
  }
  RefCntAutoPtr<Diligent::BufferViewVkImpl>::RefCntAutoPtr
            ((RefCntAutoPtr<Diligent::BufferViewVkImpl> *)&stack0xffffffffffffff90,
             *(IObject **)msg.field_2._8_8_,(INTERFACE_ID *)IID_BufferViewVk);
  BVar1 = DvpDescriptorTypeToBufferView(this->m_DstRes->Type);
  ResDesc = msg.field_2._8_8_;
  pPVar7 = this->m_ResDesc;
  pBVar4 = RefCntAutoPtr<Diligent::BufferViewVkImpl>::RawPtr
                     ((RefCntAutoPtr<Diligent::BufferViewVkImpl> *)&stack0xffffffffffffff90);
  msg_2.field_2._M_local_buf[0xf] = BVar1;
  pIVar5 = RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr(&this->m_DstRes->pObject);
  pPVar6 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
           ::GetDesc((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                      *)this->m_Signature);
  ExpectedViewTypes._M_len = 1;
  ExpectedViewTypes._M_array = (iterator)0x1;
  VerifyResourceViewBinding<Diligent::BufferViewVkImpl,Diligent::BUFFER_VIEW_TYPE>
            ((Diligent *)pPVar7,(PipelineResourceDesc *)ResDesc,(BindResourceInfo *)pBVar4,
             (BufferViewVkImpl *)((long)&msg_2.field_2 + 0xf),ExpectedViewTypes,
             RESOURCE_DIM_UNDEFINED,SUB81(pIVar5,0),
             (IDeviceObject *)(pPVar6->super_DeviceObjectAttribs).Name,in_stack_ffffffffffffff00);
  PVar2 = Diligent::operator&(this->m_ResDesc->Flags,PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER);
  if (PVar2 == PIPELINE_RESOURCE_FLAG_NONE) {
    FormatString<char[92]>
              ((string *)local_b0,
               (char (*) [92])
               "FORMATTED_BUFFER resource flag is not set for a texel buffer - this should\'ve not happened."
              );
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"CacheTexelBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
               ,0x1ee);
    std::__cxx11::string::~string((string *)local_b0);
  }
  pPVar7 = this->m_ResDesc;
  ArrayIndex = this->m_ArrayIndex;
  pBVar4 = RefCntAutoPtr<Diligent::BufferViewVkImpl>::RawPtr
                     ((RefCntAutoPtr<Diligent::BufferViewVkImpl> *)&stack0xffffffffffffff90);
  ValidateBufferMode<Diligent::BufferViewVkImpl>(pPVar7,ArrayIndex,pBVar4);
  UpdateCachedResource<Diligent::BufferViewVkImpl>
            (this,(RefCntAutoPtr<Diligent::BufferViewVkImpl> *)&stack0xffffffffffffff90,
             *(SET_SHADER_RESOURCE_FLAGS *)(msg.field_2._8_8_ + 8),0,0);
  RefCntAutoPtr<Diligent::BufferViewVkImpl>::~RefCntAutoPtr
            ((RefCntAutoPtr<Diligent::BufferViewVkImpl> *)&stack0xffffffffffffff90);
  return;
}

Assistant:

void BindResourceHelper::CacheTexelBuffer(const BindResourceInfo& BindInfo) const
{
    VERIFY(BindInfo.pObject != nullptr, "Setting texel buffer to null is handled by BindResourceHelper::operator()");
    VERIFY((m_DstRes.Type == DescriptorType::UniformTexelBuffer ||
            m_DstRes.Type == DescriptorType::StorageTexelBuffer ||
            m_DstRes.Type == DescriptorType::StorageTexelBuffer_ReadOnly),
           "Uniform or storage buffer resource is expected");

    RefCntAutoPtr<BufferViewVkImpl> pBufferViewVk{BindInfo.pObject, IID_BufferViewVk};
#ifdef DILIGENT_DEVELOPMENT
    {
        // HLSL buffer SRVs are mapped to storage buffers in GLSL
        const BUFFER_VIEW_TYPE RequiredViewType = DvpDescriptorTypeToBufferView(m_DstRes.Type);
        VerifyResourceViewBinding(m_ResDesc, BindInfo, pBufferViewVk.RawPtr(),
                                  {RequiredViewType},
                                  RESOURCE_DIM_BUFFER, // Expected resource dim
                                  false,               // IsMultisample (ignored when resource dim is buffer)
                                  m_DstRes.pObject.RawPtr(),
                                  m_Signature.GetDesc().Name);

        VERIFY((m_ResDesc.Flags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) != 0,
               "FORMATTED_BUFFER resource flag is not set for a texel buffer - this should've not happened.");
        ValidateBufferMode(m_ResDesc, m_ArrayIndex, pBufferViewVk.RawPtr());
    }
#endif

    UpdateCachedResource(std::move(pBufferViewVk), BindInfo.Flags);
}